

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

void Ssw_RarTransferPatterns(Ssw_RarMan_t *p,Vec_Int_t *vInits)

{
  double dVar1;
  Ssw_RarPars_t *pSVar2;
  Aig_Man_t *pAVar3;
  double *pdVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  word *pwVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  
  Ssw_RarTranspose(p);
  pSVar2 = p->pPars;
  if (pSVar2->nWords < 1) {
    uVar5 = pSVar2->nWords << 6;
  }
  else {
    pwVar10 = p->pPatData;
    iVar11 = 0;
    do {
      if (0 < p->nGroups) {
        pAVar3 = p->pAig;
        iVar14 = p->nWordsReg;
        lVar12 = 0;
        do {
          if (pAVar3->nRegs / pSVar2->nBinSize <= lVar12) {
            __assert_fail("iBin >= 0 && iBin < Aig_ManRegNum(p->pAig) / p->pPars->nBinSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x4c,"void Ssw_RarAddToBinPat(Ssw_RarMan_t *, int, int)");
          }
          bVar7 = *(byte *)((long)pwVar10 + lVar12 + (long)(iVar14 * iVar11) * 8);
          bVar6 = (byte)pSVar2->nBinSize;
          if (1 << (bVar6 & 0x1f) <= (int)(uint)bVar7) {
            __assert_fail("iPat >= 0 && iPat < (1 << p->pPars->nBinSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x4d,"void Ssw_RarAddToBinPat(Ssw_RarMan_t *, int, int)");
          }
          p->pRarity[((int)lVar12 << (bVar6 & 0x1f)) + (uint)bVar7] =
               p->pRarity[((int)lVar12 << (bVar6 & 0x1f)) + (uint)bVar7] + 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 < p->nGroups);
      }
      iVar11 = iVar11 + 1;
      uVar5 = pSVar2->nWords * 0x40;
    } while (iVar11 < (int)uVar5);
  }
  if (0 < (int)uVar5) {
    pwVar10 = p->pPatData;
    iVar11 = p->nWordsReg;
    pdVar4 = p->pPatCosts;
    uVar8 = p->nGroups;
    uVar13 = 0;
    do {
      pdVar4[uVar13] = 0.0;
      if (0 < (int)uVar8) {
        uVar15 = (long)p->pAig->nRegs / (long)pSVar2->nBinSize;
        uVar9 = uVar15 & 0xffffffff;
        bVar7 = (byte)pSVar2->nBinSize;
        if ((int)uVar15 < 1) {
          uVar9 = 0;
        }
        uVar15 = 0;
        do {
          if (uVar9 == uVar15) {
            __assert_fail("iBin >= 0 && iBin < Aig_ManRegNum(p->pAig) / p->pPars->nBinSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x40,"int Ssw_RarGetBinPat(Ssw_RarMan_t *, int, int)");
          }
          if (1 << (bVar7 & 0x1f) <= (int)(uint)*(byte *)((long)pwVar10 + uVar15)) {
            __assert_fail("iPat >= 0 && iPat < (1 << p->pPars->nBinSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x41,"int Ssw_RarGetBinPat(Ssw_RarMan_t *, int, int)");
          }
          iVar14 = p->pRarity
                   [((int)uVar15 << (bVar7 & 0x1f)) + (uint)*(byte *)((long)pwVar10 + uVar15)];
          if (iVar14 < 1) {
            __assert_fail("Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x349,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
          }
          pdVar4[uVar13] = 1.0 / (double)(iVar14 * iVar14) + pdVar4[uVar13];
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
      uVar13 = uVar13 + 1;
      pwVar10 = pwVar10 + iVar11;
    } while (uVar13 != uVar5);
  }
  vInits->nSize = 0;
  iVar11 = p->pPars->nWords;
  if (0 < iVar11) {
    iVar14 = 0;
    do {
      uVar5 = iVar11 * 0x40;
      if (iVar11 < 1) {
        uVar8 = 0xffffffff;
      }
      else {
        uVar13 = 1;
        if (1 < (int)uVar5) {
          uVar13 = (ulong)uVar5;
        }
        uVar15 = 0xffffffff;
        uVar9 = 0;
        dVar16 = -1000000000.0;
        do {
          dVar1 = p->pPatCosts[uVar9];
          if (dVar16 < dVar1) {
            uVar15 = uVar9 & 0xffffffff;
          }
          uVar8 = (uint)uVar15;
          if (dVar1 <= dVar16) {
            dVar1 = dVar16;
          }
          dVar16 = dVar1;
          uVar9 = uVar9 + 1;
        } while (uVar13 != uVar9);
      }
      if ((int)uVar8 < 0) {
        __assert_fail("iPatBest >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x35e,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
      }
      p->pPatCosts[uVar8] = -1000000000.0;
      if ((int)uVar5 <= (int)uVar8) {
        __assert_fail("Id < 64 * p->pPars->nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x54,"word *Ssw_RarPatSim(Ssw_RarMan_t *, int)");
      }
      if (0 < p->pAig->nRegs) {
        iVar11 = p->nWordsReg;
        pwVar10 = p->pPatData;
        uVar13 = 0;
        do {
          Vec_IntPush(vInits,(uint)((*(uint *)((long)pwVar10 +
                                              (uVar13 >> 5) * 4 +
                                              (long)(int)uVar8 * (long)iVar11 * 8) >>
                                     ((uint)uVar13 & 0x1f) & 1) != 0));
          uVar5 = (uint)uVar13 + 1;
          uVar13 = (ulong)uVar5;
        } while ((int)uVar5 < p->pAig->nRegs);
      }
      Vec_IntPush(p->vPatBests,uVar8);
      iVar14 = iVar14 + 1;
      iVar11 = p->pPars->nWords;
    } while (iVar14 < iVar11);
  }
  if (vInits->nSize != iVar11 * p->pAig->nRegs) {
    __assert_fail("Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                  ,0x367,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

static void Ssw_RarTransferPatterns( Ssw_RarMan_t * p, Vec_Int_t * vInits )
{
//    Aig_Obj_t * pObj;
    unsigned char * pData;
    unsigned * pPattern;
    int i, k, Value;

    // more data from regs to pats
    Ssw_RarTranspose( p );

    // update counters
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        for ( i = 0; i < p->nGroups; i++ )
            Ssw_RarAddToBinPat( p, i, pData[i] );
    }

    // for each pattern
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        // find the cost of its values
        p->pPatCosts[k] = 0.0;
        for ( i = 0; i < p->nGroups; i++ )
        {
            Value = Ssw_RarGetBinPat( p, i, pData[i] );
            assert( Value > 0 );
            p->pPatCosts[k] += 1.0/(Value*Value);
        }
        // print the result
//Abc_Print( 1, "%3d : %9.6f\n", k, p->pPatCosts[k] );
    }

    // choose as many as there are words
    Vec_IntClear( vInits );
    for ( i = 0; i < p->pPars->nWords; i++ )
    {
        // select the best
        int iPatBest = -1;
        double iCostBest = -ABC_INFINITY;
        for ( k = 0; k < p->pPars->nWords * 64; k++ )
            if ( iCostBest < p->pPatCosts[k] )
            {
                iCostBest = p->pPatCosts[k];
                iPatBest  = k;
            }
        // remove from costs
        assert( iPatBest >= 0 );
        p->pPatCosts[iPatBest] = -ABC_INFINITY;
        // set the flops
        pPattern = (unsigned *)Ssw_RarPatSim( p, iPatBest );
        for ( k = 0; k < Aig_ManRegNum(p->pAig); k++ )
            Vec_IntPush( vInits, Abc_InfoHasBit(pPattern, k) );
//Abc_Print( 1, "Best pattern %5d\n", iPatBest );
        Vec_IntPush( p->vPatBests, iPatBest );
    }
    assert( Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords );
}